

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_8::setCloexec::anon_class_8_1_3fcf657c::operator()(anon_class_8_1_3fcf657c *this)

{
  int iVar1;
  anon_class_8_1_3fcf657c *this_local;
  
  iVar1 = ioctl(*this->fd,0x5451);
  return iVar1;
}

Assistant:

KJ_SYSCALL_HANDLE_ERRORS(ioctl(fd, FIOCLEX)) {
    case EINVAL:
    case EOPNOTSUPP:
      break;
    default:
      KJ_FAIL_SYSCALL("ioctl(fd, FIOCLEX)", error) { break; }
      break;
  }